

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_node.h
# Opt level: O3

void __thiscall compose::TreeNode::~TreeNode(TreeNode *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_INode)._vptr_INode = (_func_int **)&PTR_AddNode_00129898;
  std::vector<std::shared_ptr<compose::INode>,_std::allocator<std::shared_ptr<compose::INode>_>_>::
  ~vector(&this->nodes_);
  (this->super_INode)._vptr_INode = (_func_int **)&PTR___cxa_pure_virtual_00129b20;
  pcVar1 = (this->super_INode).name_._M_dataplus._M_p;
  paVar2 = &(this->super_INode).name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

TreeNode::~TreeNode() {}